

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O0

void __thiscall
s_energy_matrix::compute_energy_restricted
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  bool bVar1;
  undefined2 uVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  vector<Node,_std::allocator<Node>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  short *in_RDI;
  s_energy_matrix *unaff_retaddr;
  sparse_tree *in_stack_00000028;
  int ij;
  bool canH;
  bool paired;
  cand_pos_t in_stack_00000030;
  bool unpaired;
  pair_type ptype_closing;
  char type;
  cand_pos_t min_rank;
  cand_pos_t k;
  energy_t min_en [3];
  energy_t min;
  cand_pos_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffc0;
  byte bVar7;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  char cVar8;
  int local_30;
  int local_2c;
  int local_28;
  energy_t local_24;
  cand_pos_t j_00;
  int local_1c;
  short *psVar9;
  
  local_30 = -1;
  local_1c = 5000000;
  local_28 = 10000000;
  local_24 = 10000000;
  j_00 = 10000000;
  uVar2 = (undefined2)
          pair[*(short *)(*(long *)(in_RDI + 4) + (long)in_ESI * 2)]
          [*(short *)(*(long *)(in_RDI + 4) + (long)in_EDX * 2)];
  psVar9 = in_RDI;
  pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RCX,(long)in_ESI);
  in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 & 0xffffff;
  if (pvVar4->pair < -1) {
    pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RCX,(long)in_EDX);
    in_stack_ffffffffffffffc0 = CONCAT13(pvVar4->pair < -1,(int3)in_stack_ffffffffffffffc0);
  }
  bVar7 = (byte)(in_stack_ffffffffffffffc0 >> 0x18);
  pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RCX,(long)in_ESI);
  in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 & 0xffffff;
  if (pvVar4->pair == in_EDX) {
    pvVar4 = std::vector<Node,_std::allocator<Node>_>::operator[](in_RCX,(long)in_EDX);
    in_stack_ffffffffffffffb4 = CONCAT13(pvVar4->pair == in_ESI,(int3)in_stack_ffffffffffffffb4);
  }
  cVar8 = (char)(in_stack_ffffffffffffffb4 >> 0x18);
  if ((cVar8 != '\0') || ((bVar7 & 1) != 0)) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RCX + 6),(long)(in_EDX + -1));
    bVar1 = *pvVar5 < (in_EDX - in_ESI) + -1;
    if (!bVar1) {
      local_28 = HairpinE((s_energy_matrix *)
                          ((CONCAT17(in_stack_ffffffffffffffcf,
                                     CONCAT16(in_stack_ffffffffffffffce,
                                              CONCAT24(uVar2,CONCAT13(bVar7,CONCAT12(cVar8,CONCAT11(
                                                  bVar1,in_stack_ffffffffffffffc8)))))) ^ 0xff00) &
                          0xffffffffffff01ff),
                          (string *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_RDI,(short *)CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0),
                          (paramT *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa4,j_00);
    }
    local_24 = compute_internal_restricted
                         (unaff_retaddr,(cand_pos_t)((ulong)psVar9 >> 0x20),(cand_pos_t)psVar9,
                          (paramT *)CONCAT44(in_ESI,in_EDX),
                          (vector<int,_std::allocator<int>_> *)in_RCX);
    compute_energy_VM_restricted(_min_rank,_ptype_closing,in_stack_00000030,in_stack_00000028);
  }
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    if ((&local_28)[local_2c] < local_1c) {
      local_1c = (&local_28)[local_2c];
      local_30 = local_2c;
    }
  }
  if (local_30 == 0) {
    cVar8 = 'H';
  }
  else if (local_30 == 1) {
    cVar8 = 'I';
  }
  else if (local_30 == 2) {
    cVar8 = 'M';
  }
  else {
    cVar8 = 'N';
  }
  if (local_1c < 5000000) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x44),(long)in_ESI);
    iVar3 = (*pvVar5 + in_EDX) - in_ESI;
    pvVar6 = std::vector<free_energy_node,_std::allocator<free_energy_node>_>::operator[]
                       ((vector<free_energy_node,_std::allocator<free_energy_node>_> *)
                        (in_RDI + 0x50),(long)iVar3);
    pvVar6->energy = local_1c;
    pvVar6 = std::vector<free_energy_node,_std::allocator<free_energy_node>_>::operator[]
                       ((vector<free_energy_node,_std::allocator<free_energy_node>_> *)
                        (in_RDI + 0x50),(long)iVar3);
    pvVar6->type = cVar8;
  }
  return;
}

Assistant:

void s_energy_matrix::compute_energy_restricted (cand_pos_t i, cand_pos_t j, sparse_tree &tree)
// compute the V(i,j) value, if the structure must be restricted
{
    energy_t min, min_en[3];
    cand_pos_t k, min_rank;
    char type;

    min_rank = -1;
    min = INF/2;
    min_en[0] = INF;
    min_en[1] = INF;
    min_en[2] = INF;


	const pair_type ptype_closing = pair[S_[i]][S_[j]];
    const bool unpaired = (tree.tree[i].pair<-1 && tree.tree[j].pair<-1);
	const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);
    if (paired || unpaired)    // if i and j can pair
    {
        bool canH = !(tree.up[j-1]<(j-i-1));
        if(canH) min_en[0] = HairpinE(seq_,S_,S1_,params_,i,j);

        min_en[1] = compute_internal_restricted(i,j,params_,tree.up);
        min_en[2] = compute_energy_VM_restricted(i,j,tree);
    }

    for (k=0; k<3; k++)
    {
        if (min_en[k] < min)
        {
            min = min_en[k];
            min_rank = k;
        }
    }

    switch (min_rank)
    {
        case  0: type = HAIRP; break;
        case  1: type = INTER; break;
        case  2: type = MULTI; break;
        default: type = NONE;
    }

    if (min < INF/2) {
        int ij = index[i]+j-i;
        nodes[ij].energy = min;
        nodes[ij].type = type;
    }
}